

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__jpeg_decode_block_prog_dc(stbi__jpeg *j,short *data,stbi__huffman *hdc,int b)

{
  int iVar1;
  int in_ECX;
  short *in_RSI;
  long in_RDI;
  int t;
  int dc;
  int diff;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  int local_4;
  
  if (*(int *)(in_RDI + 0x4838) == 0) {
    if (*(int *)(in_RDI + 0x4824) < 0x10) {
      stbi__grow_buffer_unsafe
                ((stbi__jpeg *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    }
    if (*(int *)(in_RDI + 0x483c) == 0) {
      memset(in_RSI,0,0x80);
      iVar1 = stbi__jpeg_huff_decode
                        ((stbi__jpeg *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                         (stbi__huffman *)
                         CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      if (iVar1 == 0) {
        iVar1 = 0;
      }
      else {
        iVar1 = stbi__extend_receive
                          ((stbi__jpeg *)CONCAT44(in_stack_ffffffffffffffd4,iVar1),
                           in_stack_ffffffffffffffcc);
      }
      iVar1 = *(int *)(in_RDI + (long)in_ECX * 0x60 + 0x46b8) + iVar1;
      *(int *)(in_RDI + (long)in_ECX * 0x60 + 0x46b8) = iVar1;
      *in_RSI = (short)(iVar1 << ((byte)*(undefined4 *)(in_RDI + 0x4840) & 0x1f));
    }
    else {
      iVar1 = stbi__jpeg_get_bit((stbi__jpeg *)
                                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      if (iVar1 != 0) {
        *in_RSI = *in_RSI + (short)(1 << ((byte)*(undefined4 *)(in_RDI + 0x4840) & 0x1f));
      }
    }
    local_4 = 1;
  }
  else {
    local_4 = stbi__err("can\'t merge dc and ac");
  }
  return local_4;
}

Assistant:

static int stbi__jpeg_decode_block_prog_dc(stbi__jpeg *j, short data[64], stbi__huffman *hdc, int b)
{
   int diff,dc;
   int t;
   if (j->spec_end != 0) return stbi__err("can't merge dc and ac", "Corrupt JPEG");

   if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);

   if (j->succ_high == 0) {
      // first scan for DC coefficient, must be first
      memset(data,0,64*sizeof(data[0])); // 0 all the ac values now
      t = stbi__jpeg_huff_decode(j, hdc);
      diff = t ? stbi__extend_receive(j, t) : 0;

      dc = j->img_comp[b].dc_pred + diff;
      j->img_comp[b].dc_pred = dc;
      data[0] = (short) (dc << j->succ_low);
   } else {
      // refinement scan for DC coefficient
      if (stbi__jpeg_get_bit(j))
         data[0] += (short) (1 << j->succ_low);
   }
   return 1;
}